

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

long count_deadends(void)

{
  bool bVar1;
  bool bVar2;
  long total_deadends;
  long lVar3;
  __node_base *p_Var4;
  
  p_Var4 = &Node::nodes._M_h._M_before_begin;
  lVar3 = 0;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    bVar1 = Edges::empty((Edges *)(p_Var4 + 4));
    bVar2 = Edges::empty((Edges *)(p_Var4 + 7));
    lVar3 = lVar3 + (ulong)bVar1 + (ulong)bVar2;
  }
  return lVar3;
}

Assistant:

long count_deadends() {
    long total_deadends = 0;
    for (auto &node: Node::nodes) {
        if (node.second.left_edges.empty())
            total_deadends++;
        if (node.second.right_edges.empty())
            total_deadends++;
    }
    return total_deadends;
}